

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::TransformEnd(ParsedScene *this,FileLoc loc)

{
  bool bVar1;
  reference __src;
  reference pvVar2;
  reference pvVar3;
  char *unaff_RBX;
  char (*in_RDI) [13];
  FileLoc *unaff_retaddr;
  char (*in_stack_00000008) [4];
  char (*in_stack_00000010) [23];
  char *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  char vb;
  LogLevel in_stack_00000034;
  char va;
  char (*in_stack_00000040) [23];
  char *in_stack_00000048;
  FileLoc *in_stack_ffffffffffffffb8;
  FileLoc *in_stack_ffffffffffffffc0;
  FileLoc *in_stack_ffffffffffffffc8;
  SceneRepresentation *in_stack_ffffffffffffffd0;
  
  if (*(int *)(in_RDI[0xa4] + 0xc) == 2) {
    Error<char_const(&)[13]>(unaff_retaddr,unaff_RBX,in_RDI);
  }
  else if (*(int *)(in_RDI[0xa4] + 0xc) == 0) {
    Error<char_const(&)[13]>(unaff_retaddr,unaff_RBX,in_RDI);
  }
  else {
    bVar1 = std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::empty
                      ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
                       in_stack_ffffffffffffffd0);
    if (bVar1) {
      Error(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
    }
    else {
      __src = std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::back
                        ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
                         in_stack_ffffffffffffffc0);
      memcpy(in_RDI[0xa5] + 3,__src,0x100);
      std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::pop_back
                ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)0x67bd7b);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffffc0);
      *(value_type *)(in_RDI[0xb8] + 0xc) = *pvVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x67bda5);
      pvVar3 = std::
               vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
               ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                       *)in_stack_ffffffffffffffc0);
      if (pvVar3->first == 'a') {
        std::
        vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
        back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
              *)in_stack_ffffffffffffffc0);
        SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        pvVar3 = std::
                 vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                 ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                         *)in_stack_ffffffffffffffc0);
        if (pvVar3->first == 'o') {
          std::
          vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
          back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                *)in_stack_ffffffffffffffc0);
          SceneRepresentation::ErrorExitDeferred<pbrt::FileLoc&>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
        else {
          pvVar3 = std::
                   vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                   ::back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                           *)in_stack_ffffffffffffffc0);
          if (pvVar3->first != 't') {
            LogFatal<char_const(&)[23],char_const(&)[4],char_const(&)[23],char&,char_const(&)[4],char&>
                      (in_stack_00000034,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                       in_stack_00000010,in_stack_00000008,in_stack_00000040,in_stack_00000048,
                       (char (*) [4])loc.filename._M_len,loc.filename._M_str);
          }
        }
      }
      std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
      ::pop_back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                  *)0x67becb);
    }
  }
  return;
}

Assistant:

void ParsedScene::TransformEnd(FileLoc loc) {
    VERIFY_WORLD("TransformEnd");
    if (pushedTransforms.empty()) {
        Error(&loc, "Unmatched TransformEnd encountered. Ignoring it.");
        return;
    }
    curTransform = pushedTransforms.back();
    pushedTransforms.pop_back();
    activeTransformBits = pushedActiveTransformBits.back();
    pushedActiveTransformBits.pop_back();

    if (pushStack.back().first == 'a')
        ErrorExitDeferred(
            &loc, "Mismatched nesting: open AttributeBegin from %s at TransformEnd",
            pushStack.back().second);
    else if (pushStack.back().first == 'o')
        ErrorExitDeferred(&loc,
                          "Mismatched nesting: open ObjectBegin from %s at TransformEnd",
                          pushStack.back().second);
    else
        CHECK_EQ(pushStack.back().first, 't');
    pushStack.pop_back();
}